

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CIrrDeviceSDL.cpp
# Opt level: O0

bool __thiscall irr::CIrrDeviceSDL::run(CIrrDeviceSDL *this)

{
  byte bVar1;
  undefined2 uVar2;
  int iVar3;
  s32 sVar4;
  u32 uVar5;
  SKeyMap *pSVar6;
  _SDL_Joystick **pp_Var7;
  int *piVar8;
  long *in_RDI;
  bool bVar9;
  double __x;
  int numAxes;
  int numButtons;
  int j;
  SDL_Joystick *joystick;
  u32 i;
  SEvent joyevent;
  EKEY_CODE key;
  s32 idx;
  SKeyMap mp;
  u32 clicks;
  SDL_Keymod keymod_2;
  SDL_Keymod keymod_1;
  SDL_Keymod keymod;
  SDL_Event SDL_event;
  SEvent irrevent;
  ulong in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  uint uVar10;
  SKeyMap *in_stack_fffffffffffffea8;
  array<irr::CIrrDeviceSDL::SKeyMap> *in_stack_fffffffffffffeb0;
  array<irr::CIrrDeviceSDL::SKeyMap> *in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  uint in_stack_fffffffffffffec4;
  int local_124;
  int local_120;
  int local_11c;
  int local_118;
  int local_114;
  int local_110;
  int local_10c;
  _SDL_Joystick *local_108;
  uint local_fc;
  undefined4 local_f8 [2];
  uint local_f0;
  undefined2 local_ec [18];
  undefined2 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3a;
  undefined5 in_stack_ffffffffffffff3b;
  dimension2d<unsigned_int> in_stack_ffffffffffffff40;
  EKEY_CODE local_98;
  SKeyMap local_90;
  int local_88;
  uint local_84;
  uint local_80;
  uint local_7c;
  int local_78 [3];
  char local_6c;
  uint local_68;
  int iStack_64;
  ushort local_60;
  undefined2 uStack_5e;
  float fStack_5c;
  undefined4 local_58;
  undefined4 local_40 [2];
  undefined8 local_38;
  undefined8 local_30;
  undefined4 local_28;
  int local_24;
  
  os::Timer::tick();
  do {
    bVar9 = false;
    if ((*(byte *)(in_RDI + 0x1d) & 1) == 0) {
      iVar3 = SDL_PollEvent(local_78);
      bVar9 = iVar3 != 0;
    }
    if (!bVar9) {
      SDL_JoystickUpdate();
      local_f8[0] = 8;
      local_fc = 0;
      do {
        uVar10 = local_fc;
        uVar5 = core::array<_SDL_Joystick_*>::size((array<_SDL_Joystick_*> *)0x39063a);
        if (uVar5 <= uVar10) {
          return (bool)((*(byte *)(in_RDI + 0x1d) ^ 0xff) & 1);
        }
        pp_Var7 = core::array<_SDL_Joystick_*>::operator[]
                            ((array<_SDL_Joystick_*> *)CONCAT44(uVar10,in_stack_fffffffffffffea0),
                             (u32)(in_stack_fffffffffffffe98 >> 0x20));
        local_108 = *pp_Var7;
        if (local_108 != (_SDL_Joystick *)0x0) {
          local_114 = SDL_JoystickNumButtons(local_108);
          local_118 = 0x20;
          piVar8 = core::min_<int>(&local_114,&local_118);
          local_110 = *piVar8;
          local_f0 = 0;
          for (local_10c = 0; local_10c < local_110; local_10c = local_10c + 1) {
            bVar1 = SDL_JoystickGetButton(local_108,local_10c);
            local_f0 = (uint)bVar1 << ((byte)local_10c & 0x1f) | local_f0;
          }
          local_120 = SDL_JoystickNumAxes(local_108);
          local_124 = 0x12;
          piVar8 = core::min_<int>(&local_120,&local_124);
          local_11c = *piVar8;
          local_ec[0] = 0;
          local_ec[1] = 0;
          local_ec[2] = 0;
          local_ec[3] = 0;
          local_ec[4] = 0;
          local_ec[5] = 0;
          for (local_10c = 0; local_10c < local_11c; local_10c = local_10c + 1) {
            uVar2 = SDL_JoystickGetAxis(local_108);
            local_ec[local_10c] = uVar2;
          }
          iVar3 = SDL_JoystickNumHats(local_108);
          if (0 < iVar3) {
            bVar1 = SDL_JoystickGetHat(local_108,0);
            in_stack_fffffffffffffe98 = (ulong)bVar1;
            switch(in_stack_fffffffffffffe98) {
            case 0:
            default:
              break;
            case 1:
              break;
            case 2:
              break;
            case 3:
              break;
            case 4:
              break;
            case 6:
              break;
            case 8:
              break;
            case 9:
              break;
            case 0xc:
            }
          }
          (**(code **)(*in_RDI + 200))(in_RDI,local_f8);
        }
        local_fc = local_fc + 1;
      } while( true );
    }
    if (local_78[0] == 0x100) {
      *(undefined1 *)(in_RDI + 0x1d) = 1;
    }
    else if (local_78[0] == 0x200) {
      if ((local_6c == '\x05') &&
         ((local_68 != *(uint *)((long)in_RDI + 0x13c) || (iStack_64 != (int)in_RDI[0x28])))) {
        *(uint *)((long)in_RDI + 0x13c) = local_68;
        *(int *)(in_RDI + 0x28) = iStack_64;
        if (in_RDI[1] != 0) {
          in_stack_fffffffffffffea8 = (SKeyMap *)in_RDI[1];
          core::dimension2d<unsigned_int>::dimension2d
                    ((dimension2d<unsigned_int> *)&stack0xffffffffffffff40,
                     (uint *)((long)in_RDI + 0x13c),(uint *)(in_RDI + 0x28));
          (**(code **)((long)*in_stack_fffffffffffffea8 + 0x260))
                    (in_stack_fffffffffffffea8,&stack0xffffffffffffff40);
        }
      }
LAB_003903cb:
      local_40[0] = 10;
      local_38 = (array<irr::CIrrDeviceSDL::SKeyMap> *)CONCAT44(iStack_64,local_68);
      local_30 = CONCAT44(fStack_5c,CONCAT22(uStack_5e,local_60));
      (**(code **)(*in_RDI + 200))(in_RDI,local_40);
    }
    else if (local_78[0] - 0x300U < 2) {
      SKeyMap::SKeyMap(&local_90);
      local_90.SDLKey = iStack_64;
      sVar4 = core::array<irr::CIrrDeviceSDL::SKeyMap>::binary_search
                        (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      if (sVar4 == -1) {
        local_98 = KEY_UNKNOWN;
      }
      else {
        pSVar6 = core::array<irr::CIrrDeviceSDL::SKeyMap>::operator[]
                           ((array<irr::CIrrDeviceSDL::SKeyMap> *)
                            CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                            (u32)(in_stack_fffffffffffffe98 >> 0x20));
        local_98 = pSVar6->Win32Key;
      }
      if (local_98 == KEY_UNKNOWN) {
        core::string<char>::string
                  ((string<char> *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                   (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
        os::Printer::log(__x);
        core::string<char>::~string((string<char> *)0x39021e);
      }
      iVar3 = SDL_IsTextInputActive();
      if (((iVar3 == 0) || (bVar9 = keyIsKnownSpecial(local_98), bVar9)) || ((local_60 & 0xc0) != 0)
         ) {
        local_40[0] = 2;
        local_38._4_4_ = local_98;
        local_30._0_5_ =
             CONCAT14(local_30._4_1_ & 0xf8 | local_78[0] == 0x300 | ((local_60 & 3) != 0) << 1 |
                      ((local_60 & 0xc0) != 0) << 2,(undefined4)local_30);
        iVar3 = findCharToPassToIrrlicht(local_90.SDLKey,local_98);
        local_38 = (array<irr::CIrrDeviceSDL::SKeyMap> *)CONCAT44(local_38._4_4_,iVar3);
        (**(code **)(*in_RDI + 200))(in_RDI,local_40);
      }
    }
    else if (local_78[0] == 0x303) {
      local_40[0] = 3;
      in_stack_fffffffffffffeb0 = (array<irr::CIrrDeviceSDL::SKeyMap> *)operator_new(0x20);
      core::string<wchar_t>::string((string<wchar_t> *)0x3900f0);
      local_38 = in_stack_fffffffffffffeb0;
      core::utf8ToWString((stringw *)in_stack_ffffffffffffff40,
                          (char *)CONCAT53(in_stack_ffffffffffffff3b,
                                           CONCAT12(in_stack_ffffffffffffff3a,
                                                    in_stack_ffffffffffffff38)));
      (**(code **)(*in_RDI + 200))(in_RDI,local_40);
      in_stack_fffffffffffffeb8 = local_38;
      if (local_38 != (array<irr::CIrrDeviceSDL::SKeyMap> *)0x0) {
        core::string<wchar_t>::~string((string<wchar_t> *)0x390149);
        operator_delete(in_stack_fffffffffffffeb8,0x20);
      }
      local_38 = (array<irr::CIrrDeviceSDL::SKeyMap> *)0x0;
    }
    else if (local_78[0] == 0x400) {
      local_7c = SDL_GetModState();
      local_40[0] = 1;
      local_24 = 6;
      *(int *)(in_RDI + 0x25) = iStack_64;
      local_38 = (array<irr::CIrrDeviceSDL::SKeyMap> *)
                 CONCAT44(CONCAT22(uStack_5e,local_60),iStack_64);
      *(uint *)((long)in_RDI + 300) = CONCAT22(uStack_5e,local_60);
      *(float *)(in_RDI + 0x26) = fStack_5c;
      *(undefined4 *)((long)in_RDI + 0x134) = local_58;
      local_28 = (undefined4)in_RDI[0x27];
      local_30._0_5_ =
           CONCAT14(local_30._4_1_ & 0xfc | (local_7c & 3) != 0 | ((local_7c & 0xc0) != 0) << 1,
                    (undefined4)local_30);
      (**(code **)(*in_RDI + 200))(in_RDI,local_40);
    }
    else if (local_78[0] - 0x401U < 2) {
      local_84 = SDL_GetModState();
      local_40[0] = 1;
      local_38 = (array<irr::CIrrDeviceSDL::SKeyMap> *)
                 CONCAT44(CONCAT22(uStack_5e,local_60),iStack_64);
      local_30._0_5_ =
           CONCAT14(local_30._4_1_ & 0xfc | (local_84 & 3) != 0 | ((local_84 & 0xc0) != 0) * '\x02',
                    (undefined4)local_30);
      local_24 = 6;
      in_stack_fffffffffffffec4 = local_68 & 0xff;
      if (in_stack_fffffffffffffec4 == 1) {
        if (local_78[0] == 0x401) {
          local_24 = 0;
          *(uint *)(in_RDI + 0x27) = *(uint *)(in_RDI + 0x27) | 1;
        }
        else {
          local_24 = 3;
          *(uint *)(in_RDI + 0x27) = *(uint *)(in_RDI + 0x27) & 0xfffffffe;
        }
      }
      else if (in_stack_fffffffffffffec4 == 2) {
        if (local_78[0] == 0x401) {
          local_24 = 2;
          *(uint *)(in_RDI + 0x27) = *(uint *)(in_RDI + 0x27) | 4;
        }
        else {
          local_24 = 5;
          *(uint *)(in_RDI + 0x27) = *(uint *)(in_RDI + 0x27) & 0xfffffffb;
        }
      }
      else if (in_stack_fffffffffffffec4 == 3) {
        if (local_78[0] == 0x401) {
          local_24 = 1;
          *(uint *)(in_RDI + 0x27) = *(uint *)(in_RDI + 0x27) | 2;
        }
        else {
          local_24 = 4;
          *(uint *)(in_RDI + 0x27) = *(uint *)(in_RDI + 0x27) & 0xfffffffd;
        }
      }
      local_28 = (undefined4)in_RDI[0x27];
      if (((local_24 != 6) && ((**(code **)(*in_RDI + 200))(in_RDI,local_40), -1 < local_24)) &&
         (local_24 < 3)) {
        local_88 = (**(code **)(*in_RDI + 0x1a8))
                             (in_RDI,(ulong)local_38 & 0xffffffff,local_38._4_4_,local_24);
        if (local_88 == 2) {
          local_24 = local_24 + 8;
          (**(code **)(*in_RDI + 200))(in_RDI,local_40);
        }
        else if (local_88 == 3) {
          local_24 = local_24 + 0xb;
          (**(code **)(*in_RDI + 200))(in_RDI,local_40);
        }
      }
    }
    else if (local_78[0] == 0x403) {
      local_80 = SDL_GetModState();
      local_40[0] = 1;
      local_24 = 7;
      local_30._0_5_ =
           CONCAT14(local_30._4_1_ & 0xfc | (local_80 & 3) != 0 | ((local_80 & 0xc0) != 0) << 1,
                    local_58);
      local_38 = (array<irr::CIrrDeviceSDL::SKeyMap> *)in_RDI[0x25];
      (**(code **)(*in_RDI + 200))(in_RDI,local_40);
    }
    else if (local_78[0] == 0x700) {
      local_40[0] = 4;
      local_24 = 0;
      local_38 = (array<irr::CIrrDeviceSDL::SKeyMap> *)CONCAT44(iStack_64,local_68);
      local_30 = CONCAT44((int)(fStack_5c * (float)*(uint *)(in_RDI + 0x28)),
                          (int)((float)CONCAT22(uStack_5e,local_60) *
                               (float)*(uint *)((long)in_RDI + 0x13c)));
      *(int *)(in_RDI + 0x38) = (int)in_RDI[0x38] + 1;
      local_28 = (undefined4)in_RDI[0x38];
      (**(code **)(*in_RDI + 200))(in_RDI,local_40);
    }
    else if (local_78[0] == 0x701) {
      local_40[0] = 4;
      local_24 = 1;
      local_38 = (array<irr::CIrrDeviceSDL::SKeyMap> *)CONCAT44(iStack_64,local_68);
      local_30 = CONCAT44((int)(fStack_5c * (float)*(uint *)(in_RDI + 0x28)),
                          (int)((float)CONCAT22(uStack_5e,local_60) *
                               (float)*(uint *)((long)in_RDI + 0x13c)));
      local_28 = (undefined4)in_RDI[0x38];
      if (0 < (int)in_RDI[0x38]) {
        *(int *)(in_RDI + 0x38) = (int)in_RDI[0x38] + -1;
      }
      (**(code **)(*in_RDI + 200))(in_RDI,local_40);
    }
    else if (local_78[0] == 0x702) {
      local_40[0] = 4;
      local_24 = 2;
      local_38 = (array<irr::CIrrDeviceSDL::SKeyMap> *)CONCAT44(iStack_64,local_68);
      local_30 = CONCAT44((int)(fStack_5c * (float)*(uint *)(in_RDI + 0x28)),
                          (int)((float)CONCAT22(uStack_5e,local_60) *
                               (float)*(uint *)((long)in_RDI + 0x13c)));
      local_28 = (undefined4)in_RDI[0x38];
      (**(code **)(*in_RDI + 200))(in_RDI,local_40);
    }
    else if (local_78[0] == 0x8000) goto LAB_003903cb;
    resetReceiveTextInputEvents
              ((CIrrDeviceSDL *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  } while( true );
}

Assistant:

bool CIrrDeviceSDL::run()
{
	os::Timer::tick();

	SEvent irrevent;
	SDL_Event SDL_event;

	while (!Close && SDL_PollEvent(&SDL_event)) {
		// os::Printer::log("event: ", core::stringc((int)SDL_event.type).c_str(),   ELL_INFORMATION);	// just for debugging

		switch (SDL_event.type) {
		case SDL_MOUSEMOTION: {
			SDL_Keymod keymod = SDL_GetModState();

			irrevent.EventType = irr::EET_MOUSE_INPUT_EVENT;
			irrevent.MouseInput.Event = irr::EMIE_MOUSE_MOVED;
			MouseX = irrevent.MouseInput.X = SDL_event.motion.x;
			MouseY = irrevent.MouseInput.Y = SDL_event.motion.y;
			MouseXRel = SDL_event.motion.xrel;
			MouseYRel = SDL_event.motion.yrel;
			irrevent.MouseInput.ButtonStates = MouseButtonStates;
			irrevent.MouseInput.Shift = (keymod & KMOD_SHIFT) != 0;
			irrevent.MouseInput.Control = (keymod & KMOD_CTRL) != 0;

			postEventFromUser(irrevent);
			break;
		}
		case SDL_MOUSEWHEEL: {
			SDL_Keymod keymod = SDL_GetModState();

			irrevent.EventType = irr::EET_MOUSE_INPUT_EVENT;
			irrevent.MouseInput.Event = irr::EMIE_MOUSE_WHEEL;
#if SDL_VERSION_ATLEAST(2, 0, 18)
			irrevent.MouseInput.Wheel = SDL_event.wheel.preciseY;
#else
			irrevent.MouseInput.Wheel = SDL_event.wheel.y;
#endif
			irrevent.MouseInput.Shift = (keymod & KMOD_SHIFT) != 0;
			irrevent.MouseInput.Control = (keymod & KMOD_CTRL) != 0;
			irrevent.MouseInput.X = MouseX;
			irrevent.MouseInput.Y = MouseY;

			postEventFromUser(irrevent);
			break;
		}
		case SDL_MOUSEBUTTONDOWN:
		case SDL_MOUSEBUTTONUP: {
			SDL_Keymod keymod = SDL_GetModState();

			irrevent.EventType = irr::EET_MOUSE_INPUT_EVENT;
			irrevent.MouseInput.X = SDL_event.button.x;
			irrevent.MouseInput.Y = SDL_event.button.y;
			irrevent.MouseInput.Shift = (keymod & KMOD_SHIFT) != 0;
			irrevent.MouseInput.Control = (keymod & KMOD_CTRL) != 0;

			irrevent.MouseInput.Event = irr::EMIE_MOUSE_MOVED;

#ifdef _IRR_EMSCRIPTEN_PLATFORM_
			// Handle mouselocking in emscripten in Windowed mode.
			// In fullscreen SDL will handle it.
			// The behavior we want windowed is - when the canvas was clicked then
			// we will lock the mouse-pointer if it should be invisible.
			// For security reasons this will be delayed until the next mouse-up event.
			// We do not pass on this event as we don't want the activation click to do anything.
			if (SDL_event.type == SDL_MOUSEBUTTONDOWN && !isFullscreen()) {
				EmscriptenPointerlockChangeEvent pointerlockStatus; // let's hope that test is not expensive ...
				if (emscripten_get_pointerlock_status(&pointerlockStatus) == EMSCRIPTEN_RESULT_SUCCESS) {
					if (CursorControl->isVisible() && pointerlockStatus.isActive) {
						emscripten_exit_pointerlock();
						return !Close;
					} else if (!CursorControl->isVisible() && !pointerlockStatus.isActive) {
						emscripten_request_pointerlock(0, true);
						return !Close;
					}
				}
			}
#endif

			switch (SDL_event.button.button) {
			case SDL_BUTTON_LEFT:
				if (SDL_event.type == SDL_MOUSEBUTTONDOWN) {
					irrevent.MouseInput.Event = irr::EMIE_LMOUSE_PRESSED_DOWN;
					MouseButtonStates |= irr::EMBSM_LEFT;
				} else {
					irrevent.MouseInput.Event = irr::EMIE_LMOUSE_LEFT_UP;
					MouseButtonStates &= ~irr::EMBSM_LEFT;
				}
				break;

			case SDL_BUTTON_RIGHT:
				if (SDL_event.type == SDL_MOUSEBUTTONDOWN) {
					irrevent.MouseInput.Event = irr::EMIE_RMOUSE_PRESSED_DOWN;
					MouseButtonStates |= irr::EMBSM_RIGHT;
				} else {
					irrevent.MouseInput.Event = irr::EMIE_RMOUSE_LEFT_UP;
					MouseButtonStates &= ~irr::EMBSM_RIGHT;
				}
				break;

			case SDL_BUTTON_MIDDLE:
				if (SDL_event.type == SDL_MOUSEBUTTONDOWN) {
					irrevent.MouseInput.Event = irr::EMIE_MMOUSE_PRESSED_DOWN;
					MouseButtonStates |= irr::EMBSM_MIDDLE;
				} else {
					irrevent.MouseInput.Event = irr::EMIE_MMOUSE_LEFT_UP;
					MouseButtonStates &= ~irr::EMBSM_MIDDLE;
				}
				break;
			}

			irrevent.MouseInput.ButtonStates = MouseButtonStates;

			if (irrevent.MouseInput.Event != irr::EMIE_MOUSE_MOVED) {
				postEventFromUser(irrevent);

				if (irrevent.MouseInput.Event >= EMIE_LMOUSE_PRESSED_DOWN && irrevent.MouseInput.Event <= EMIE_MMOUSE_PRESSED_DOWN) {
					u32 clicks = checkSuccessiveClicks(irrevent.MouseInput.X, irrevent.MouseInput.Y, irrevent.MouseInput.Event);
					if (clicks == 2) {
						irrevent.MouseInput.Event = (EMOUSE_INPUT_EVENT)(EMIE_LMOUSE_DOUBLE_CLICK + irrevent.MouseInput.Event - EMIE_LMOUSE_PRESSED_DOWN);
						postEventFromUser(irrevent);
					} else if (clicks == 3) {
						irrevent.MouseInput.Event = (EMOUSE_INPUT_EVENT)(EMIE_LMOUSE_TRIPLE_CLICK + irrevent.MouseInput.Event - EMIE_LMOUSE_PRESSED_DOWN);
						postEventFromUser(irrevent);
					}
				}
			}
			break;
		}

		case SDL_TEXTINPUT: {
			irrevent.EventType = irr::EET_STRING_INPUT_EVENT;
			irrevent.StringInput.Str = new core::stringw();
			irr::core::utf8ToWString(*irrevent.StringInput.Str, SDL_event.text.text);
			postEventFromUser(irrevent);
			delete irrevent.StringInput.Str;
			irrevent.StringInput.Str = NULL;
		} break;

		case SDL_KEYDOWN:
		case SDL_KEYUP: {
			SKeyMap mp;
			mp.SDLKey = SDL_event.key.keysym.sym;
			s32 idx = KeyMap.binary_search(mp);

			EKEY_CODE key;
			if (idx == -1)
				key = (EKEY_CODE)0;
			else
				key = (EKEY_CODE)KeyMap[idx].Win32Key;

			if (key == (EKEY_CODE)0)
				os::Printer::log("keycode not mapped", core::stringc(mp.SDLKey), ELL_DEBUG);

			// Make sure to only input special characters if something is in focus, as SDL_TEXTINPUT handles normal unicode already
			if (SDL_IsTextInputActive() && !keyIsKnownSpecial(key) && (SDL_event.key.keysym.mod & KMOD_CTRL) == 0)
				break;

			irrevent.EventType = irr::EET_KEY_INPUT_EVENT;
			irrevent.KeyInput.Key = key;
			irrevent.KeyInput.PressedDown = (SDL_event.type == SDL_KEYDOWN);
			irrevent.KeyInput.Shift = (SDL_event.key.keysym.mod & KMOD_SHIFT) != 0;
			irrevent.KeyInput.Control = (SDL_event.key.keysym.mod & KMOD_CTRL) != 0;
			irrevent.KeyInput.Char = findCharToPassToIrrlicht(mp.SDLKey, key);
			postEventFromUser(irrevent);
		} break;

		case SDL_QUIT:
			Close = true;
			break;

		case SDL_WINDOWEVENT:
			switch (SDL_event.window.event) {
			case SDL_WINDOWEVENT_RESIZED:
				if ((SDL_event.window.data1 != (int)Width) || (SDL_event.window.data2 != (int)Height)) {
					Width = SDL_event.window.data1;
					Height = SDL_event.window.data2;
					if (VideoDriver)
						VideoDriver->OnResize(core::dimension2d<u32>(Width, Height));
				}
				break;
			}

		case SDL_USEREVENT:
			irrevent.EventType = irr::EET_USER_EVENT;
			irrevent.UserEvent.UserData1 = reinterpret_cast<uintptr_t>(SDL_event.user.data1);
			irrevent.UserEvent.UserData2 = reinterpret_cast<uintptr_t>(SDL_event.user.data2);

			postEventFromUser(irrevent);
			break;

		case SDL_FINGERDOWN:
			irrevent.EventType = EET_TOUCH_INPUT_EVENT;
			irrevent.TouchInput.Event = ETIE_PRESSED_DOWN;
			irrevent.TouchInput.ID = SDL_event.tfinger.fingerId;
			irrevent.TouchInput.X = SDL_event.tfinger.x * Width;
			irrevent.TouchInput.Y = SDL_event.tfinger.y * Height;
			CurrentTouchCount++;
			irrevent.TouchInput.touchedCount = CurrentTouchCount;

			postEventFromUser(irrevent);
			break;

		case SDL_FINGERMOTION:
			irrevent.EventType = EET_TOUCH_INPUT_EVENT;
			irrevent.TouchInput.Event = ETIE_MOVED;
			irrevent.TouchInput.ID = SDL_event.tfinger.fingerId;
			irrevent.TouchInput.X = SDL_event.tfinger.x * Width;
			irrevent.TouchInput.Y = SDL_event.tfinger.y * Height;
			irrevent.TouchInput.touchedCount = CurrentTouchCount;

			postEventFromUser(irrevent);
			break;

		case SDL_FINGERUP:
			irrevent.EventType = EET_TOUCH_INPUT_EVENT;
			irrevent.TouchInput.Event = ETIE_LEFT_UP;
			irrevent.TouchInput.ID = SDL_event.tfinger.fingerId;
			irrevent.TouchInput.X = SDL_event.tfinger.x * Width;
			irrevent.TouchInput.Y = SDL_event.tfinger.y * Height;
			// To match Android behavior, still count the pointer that was
			// just released.
			irrevent.TouchInput.touchedCount = CurrentTouchCount;
			if (CurrentTouchCount > 0) {
				CurrentTouchCount--;
			}

			postEventFromUser(irrevent);
			break;

		default:
			break;
		} // end switch
		resetReceiveTextInputEvents();
	} // end while

#if defined(_IRR_COMPILE_WITH_JOYSTICK_EVENTS_)
	// TODO: Check if the multiple open/close calls are too expensive, then
	// open/close in the constructor/destructor instead

	// update joystick states manually
	SDL_JoystickUpdate();
	// we'll always send joystick input events...
	SEvent joyevent;
	joyevent.EventType = EET_JOYSTICK_INPUT_EVENT;
	for (u32 i = 0; i < Joysticks.size(); ++i) {
		SDL_Joystick *joystick = Joysticks[i];
		if (joystick) {
			int j;
			// query all buttons
			const int numButtons = core::min_(SDL_JoystickNumButtons(joystick), 32);
			joyevent.JoystickEvent.ButtonStates = 0;
			for (j = 0; j < numButtons; ++j)
				joyevent.JoystickEvent.ButtonStates |= (SDL_JoystickGetButton(joystick, j) << j);

			// query all axes, already in correct range
			const int numAxes = core::min_(SDL_JoystickNumAxes(joystick), (int)SEvent::SJoystickEvent::NUMBER_OF_AXES);
			joyevent.JoystickEvent.Axis[SEvent::SJoystickEvent::AXIS_X] = 0;
			joyevent.JoystickEvent.Axis[SEvent::SJoystickEvent::AXIS_Y] = 0;
			joyevent.JoystickEvent.Axis[SEvent::SJoystickEvent::AXIS_Z] = 0;
			joyevent.JoystickEvent.Axis[SEvent::SJoystickEvent::AXIS_R] = 0;
			joyevent.JoystickEvent.Axis[SEvent::SJoystickEvent::AXIS_U] = 0;
			joyevent.JoystickEvent.Axis[SEvent::SJoystickEvent::AXIS_V] = 0;
			for (j = 0; j < numAxes; ++j)
				joyevent.JoystickEvent.Axis[j] = SDL_JoystickGetAxis(joystick, j);

			// we can only query one hat, SDL only supports 8 directions
			if (SDL_JoystickNumHats(joystick) > 0) {
				switch (SDL_JoystickGetHat(joystick, 0)) {
				case SDL_HAT_UP:
					joyevent.JoystickEvent.POV = 0;
					break;
				case SDL_HAT_RIGHTUP:
					joyevent.JoystickEvent.POV = 4500;
					break;
				case SDL_HAT_RIGHT:
					joyevent.JoystickEvent.POV = 9000;
					break;
				case SDL_HAT_RIGHTDOWN:
					joyevent.JoystickEvent.POV = 13500;
					break;
				case SDL_HAT_DOWN:
					joyevent.JoystickEvent.POV = 18000;
					break;
				case SDL_HAT_LEFTDOWN:
					joyevent.JoystickEvent.POV = 22500;
					break;
				case SDL_HAT_LEFT:
					joyevent.JoystickEvent.POV = 27000;
					break;
				case SDL_HAT_LEFTUP:
					joyevent.JoystickEvent.POV = 31500;
					break;
				case SDL_HAT_CENTERED:
				default:
					joyevent.JoystickEvent.POV = 65535;
					break;
				}
			} else {
				joyevent.JoystickEvent.POV = 65535;
			}

			// we map the number directly
			joyevent.JoystickEvent.Joystick = static_cast<u8>(i);
			// now post the event
			postEventFromUser(joyevent);
			// and close the joystick
		}
	}
#endif
	return !Close;
}